

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::UpperInclusiveBetweenOperator,true,true,true>
                (unsigned_long *adata,unsigned_long *bdata,unsigned_long *cdata,
                SelectionVector *result_sel,idx_t count,SelectionVector *asel,SelectionVector *bsel,
                SelectionVector *csel,ValidityMask *avalidity,ValidityMask *bvalidity,
                ValidityMask *cvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  idx_t i;
  ulong uVar10;
  
  psVar1 = asel->sel_vector;
  psVar2 = bsel->sel_vector;
  psVar3 = csel->sel_vector;
  lVar8 = 0;
  iVar4 = 0;
  for (uVar10 = 0; count != uVar10; uVar10 = uVar10 + 1) {
    uVar9 = uVar10;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar9 = (ulong)result_sel->sel_vector[uVar10];
    }
    uVar5 = uVar10;
    if (psVar1 != (sel_t *)0x0) {
      uVar5 = (ulong)psVar1[uVar10];
    }
    uVar6 = uVar10;
    if (psVar2 != (sel_t *)0x0) {
      uVar6 = (ulong)psVar2[uVar10];
    }
    uVar7 = uVar10;
    if (psVar3 != (sel_t *)0x0) {
      uVar7 = (ulong)psVar3[uVar10];
    }
    uVar5 = adata[uVar5];
    uVar6 = bdata[uVar6];
    uVar7 = cdata[uVar7];
    true_sel->sel_vector[iVar4] = (sel_t)uVar9;
    iVar4 = iVar4 + (uVar5 <= uVar7 && uVar6 < uVar5);
    false_sel->sel_vector[lVar8] = (sel_t)uVar9;
    lVar8 = lVar8 + (ulong)(uVar5 > uVar7 || uVar5 <= uVar6);
  }
  return iVar4;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}